

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCAutoArray * NULLC::AutoArrayAssign(NULLCAutoArray *left,NULLCRef right)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char **ppcVar5;
  
  uVar3 = right.typeID;
  if (left == (NULLCAutoArray *)0x0) {
    left = (NULLCAutoArray *)0x0;
    nullcThrowError("ERROR: null pointer access");
  }
  else if (right.typeID == 0xf) {
    uVar1 = *(undefined8 *)(right.ptr + 8);
    *(undefined8 *)left = *(undefined8 *)right.ptr;
    *(undefined8 *)((long)&left->ptr + 4) = uVar1;
  }
  else {
    iVar2 = nullcIsArray(right.typeID);
    if (iVar2 == 0) {
      pcVar4 = nullcGetTypeName(uVar3);
      left = (NULLCAutoArray *)0x0;
      nullcThrowError("ERROR: cannot convert from \'%s\' to \'auto[]\'",pcVar4);
    }
    else {
      uVar3 = nullcGetArraySize(uVar3);
      left->len = uVar3;
      ppcVar5 = &right.ptr;
      if (uVar3 == 0xffffffff) {
        left->len = *(uint *)(right.ptr + 8);
        ppcVar5 = (char **)right.ptr;
      }
      left->ptr = *ppcVar5;
      uVar3 = nullcGetSubType(0);
      left->typeID = uVar3;
    }
  }
  return left;
}

Assistant:

NULLCAutoArray* NULLC::AutoArrayAssign(NULLCAutoArray* left, NULLCRef right)
{
	if(!left)
	{
		nullcThrowError("ERROR: null pointer access");
		return 0;
	}
	if(right.typeID == NULLC_TYPE_AUTO_ARRAY)
	{
		*left = *(NULLCAutoArray*)right.ptr;
		return left;
	}
	if(!nullcIsArray(right.typeID))
	{
		nullcThrowError("ERROR: cannot convert from '%s' to 'auto[]'", nullcGetTypeName(right.typeID));
		return 0;
	}

	left->len = nullcGetArraySize(right.typeID);
	if(left->len == ~0u)
	{
		NULLCArray *arr = (NULLCArray*)right.ptr;
		left->len = arr->len;
		left->ptr = arr->ptr;
	}else{
		left->ptr = right.ptr;
	}
	left->typeID = nullcGetSubType(right.typeID);

	return left;
}